

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O0

void __thiscall w3Interp::f32_Demote_f64_(w3Interp *this)

{
  double *pdVar1;
  w3Interp *this_local;
  
  pdVar1 = w3Stack::f64(&this->super_w3Stack);
  w3Stack::set_f32(&this->super_w3Stack,(float)*pdVar1);
  return;
}

Assistant:

INTERP (f32_Demote_f64_)
{
    set_f32 ((float)f64 ());
}